

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O2

int helicsTranslatorGetOption(HelicsTranslator trans,int option)

{
  int iVar1;
  
  iVar1 = 0;
  if ((trans != (HelicsTranslator)0x0) && (*(int *)((long)trans + 4) == -0x4c83cad2)) {
    iVar1 = (**(code **)(**(long **)((long)trans + 8) + 0x18))();
  }
  return iVar1;
}

Assistant:

int helicsTranslatorGetOption(HelicsTranslator trans, int option)
{
    auto* transObj = getTranslatorObj(trans, nullptr);
    if (transObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return transObj->transPtr->getOption(option);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}